

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_shape_blow(parser *p)

{
  void *pvVar1;
  undefined8 *puVar2;
  char *pcVar3;
  player_blow *blow;
  player_shape *shape;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    puVar2 = (undefined8 *)mem_zalloc(0x10);
    pcVar3 = parser_getstr(p,"blow");
    pcVar3 = string_make(pcVar3);
    puVar2[1] = pcVar3;
    *puVar2 = *(undefined8 *)((long)pvVar1 + 0x100);
    *(undefined8 **)((long)pvVar1 + 0x100) = puVar2;
    *(int *)((long)pvVar1 + 0x108) = *(int *)((long)pvVar1 + 0x108) + 1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_shape_blow(struct parser *p) {
	struct player_shape *shape = parser_priv(p);
	struct player_blow *blow;

	if (!shape) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	blow = mem_zalloc(sizeof(*blow));
	blow->name = string_make(parser_getstr(p, "blow"));
	blow->next = shape->blows;
	shape->blows = blow;
	shape->num_blows++;
	return PARSE_ERROR_NONE;
}